

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaVAttributesComplex(xmlSchemaValidCtxtPtr vctxt)

{
  xmlSchemaTypePtr pxVar1;
  long *plVar2;
  xmlSchemaAttributeUsePtr_conflict pxVar3;
  long lVar4;
  xmlSchemaNodeInfoPtr pxVar5;
  xmlSchemaElementPtr pxVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  xmlSchemaAttrInfoPtr pxVar10;
  xmlSchemaAttributePtr_conflict pxVar11;
  xmlSchemaAttributePtr *ppxVar12;
  xmlSchemaValPtr pxVar13;
  xmlSchemaTypePtr pxVar14;
  xmlNsPtr ns;
  xmlAttrPtr pxVar15;
  xmlGenericErrorFunc *pp_Var16;
  void **ppvVar17;
  xmlChar *pxVar18;
  xmlChar *in_RCX;
  xmlSchemaTypePtr node;
  xmlSchemaTypePtr pxVar19;
  char *pcVar20;
  int iVar21;
  xmlSchemaIDCStateObjPtr_conflict sto;
  xmlGenericErrorFunc p_Var22;
  xmlSchemaIDCStateObjPtr_conflict pxVar23;
  long lVar24;
  xmlParserErrors xVar25;
  xmlNodePtr node_00;
  xmlSchemaAttributePtr pxVar26;
  void *pvVar27;
  xmlSchemaValidCtxtPtr pxVar28;
  xmlNodePtr node_01;
  ulong uVar29;
  long lVar30;
  uint uVar31;
  int iVar32;
  ulong uVar33;
  bool bVar34;
  xmlChar prefix [12];
  xmlSchemaPSVIIDCBindingPtr_conflict str2;
  xmlChar *local_40 [2];
  
  pxVar1 = vctxt->inode->typeDef;
  plVar2 = (long *)pxVar1->attrUses;
  uVar31 = vctxt->nbAttrInfos;
  if (plVar2 == (long *)0x0) {
    uVar8 = 0;
  }
  else {
    uVar8 = *(uint *)(plVar2 + 1);
  }
  if (0 < (int)uVar8) {
    uVar33 = 0;
    do {
      pxVar3 = *(xmlSchemaAttributeUsePtr_conflict *)(*plVar2 + uVar33 * 8);
      pxVar26 = pxVar3->attrDecl;
      if (0 < (int)uVar31) {
        uVar29 = 0;
        do {
          pxVar10 = vctxt->attrInfos[uVar29];
          if (pxVar10->metaType == 0) {
            if (((*pxVar10->localName == *pxVar26->name) &&
                (iVar9 = xmlStrEqual(pxVar10->localName,pxVar26->name), iVar9 != 0)) &&
               (iVar9 = xmlStrEqual(pxVar10->nsName,pxVar26->targetNamespace), iVar9 != 0)) {
              pxVar10->state = 2;
              pxVar10->use = pxVar3;
              pxVar10->decl = pxVar26;
              pxVar10->typeDef = pxVar26->subtypes;
              goto LAB_001cdedb;
            }
          }
          uVar29 = uVar29 + 1;
        } while (uVar31 != uVar29);
      }
      pxVar28 = vctxt;
      if (pxVar3->occurs == 2) {
        if ((pxVar3->defValue != (xmlChar *)0x0) || (pxVar26->defValue != (xmlChar *)0x0)) {
          pxVar10 = xmlSchemaGetFreshAttrInfo(vctxt);
          if (pxVar10 == (xmlSchemaAttrInfoPtr)0x0) goto LAB_001ce5f7;
          pxVar10->state = 8;
          pxVar10->use = pxVar3;
          pxVar10->decl = pxVar26;
          pxVar10->typeDef = pxVar26->subtypes;
          pxVar10->localName = pxVar26->name;
          in_RCX = pxVar26->targetNamespace;
          pxVar10->nsName = in_RCX;
        }
      }
      else if (pxVar3->occurs == 1) {
        pxVar10 = xmlSchemaGetFreshAttrInfo(vctxt);
        if (pxVar10 == (xmlSchemaAttrInfoPtr)0x0) {
LAB_001ce5f7:
          xmlSchemaInternalErr2
                    ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaVAttributesComplex",
                     "calling xmlSchemaGetFreshAttrInfo()",(xmlChar *)0x0,(xmlChar *)pxVar28);
          return -1;
        }
        pxVar10->state = 4;
        pxVar10->use = pxVar3;
        pxVar10->decl = pxVar26;
      }
LAB_001cdedb:
      uVar33 = uVar33 + 1;
    } while (uVar33 != uVar8);
  }
  if (vctxt->nbAttrInfos == 0) {
    return 0;
  }
  bVar34 = pxVar1->attributeWildcard != (xmlSchemaWildcardPtr)0x0;
  node = (xmlSchemaTypePtr)CONCAT71((int7)((ulong)in_RCX >> 8),0 < (int)uVar31 && bVar34);
  if (0 < (int)uVar31 && bVar34) {
    uVar33 = 0;
    bVar34 = false;
    do {
      pxVar10 = vctxt->attrInfos[uVar33];
      if ((pxVar10->state == 1) &&
         (iVar9 = xmlSchemaCheckCVCWildcardNamespace(pxVar1->attributeWildcard,pxVar10->nsName),
         iVar9 == 0)) {
        if (pxVar1->attributeWildcard->processContents == 1) {
          pxVar10->state = 0xd;
        }
        else {
          pxVar18 = pxVar10->localName;
          pxVar11 = xmlSchemaGetAttributeDecl(vctxt->schema,pxVar18,pxVar10->nsName);
          pxVar10->decl = pxVar11;
          if (pxVar11 == (xmlSchemaAttributePtr_conflict)0x0) {
            if (pxVar1->attributeWildcard->processContents == 2) {
              pxVar10->state = 0xe;
            }
            else {
              pxVar10->state = 10;
            }
          }
          else {
            pxVar10->state = 2;
            pxVar19 = pxVar11->subtypes;
            pxVar10->typeDef = pxVar19;
            iVar9 = xmlSchemaIsDerivedFromBuiltInType(pxVar19,(int)pxVar18);
            if (iVar9 != 0) {
              if (bVar34) {
                pxVar10->state = 0xf;
                pp_Var16 = __xmlGenericError();
                p_Var22 = *pp_Var16;
                ppvVar17 = __xmlGenericErrorContext();
                node = (xmlSchemaTypePtr)0x641e;
                (*p_Var22)(*ppvVar17,"Unimplemented block at %s:%d\n",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xmlschemas.c"
                          );
              }
              else if (plVar2 != (long *)0x0) {
                bVar34 = true;
                lVar30 = plVar2[1];
                if (0 < (long)(int)lVar30) {
                  lVar4 = *plVar2;
                  lVar24 = 0;
                  do {
                    iVar9 = xmlSchemaIsDerivedFromBuiltInType
                                      (*(xmlSchemaTypePtr *)
                                        (*(long *)(*(long *)(lVar4 + lVar24 * 8) + 0x18) + 0x60),
                                       (int)pxVar18);
                    if (iVar9 != 0) {
                      pxVar10->state = 0x10;
                      pp_Var16 = __xmlGenericError();
                      p_Var22 = *pp_Var16;
                      ppvVar17 = __xmlGenericErrorContext();
                      node = (xmlSchemaTypePtr)0x6430;
                      (*p_Var22)(*ppvVar17,"Unimplemented block at %s:%d\n",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xmlschemas.c"
                                );
                      break;
                    }
                    lVar24 = lVar24 + 1;
                  } while ((int)lVar30 != lVar24);
                }
                goto LAB_001ce036;
              }
              bVar34 = true;
            }
          }
        }
      }
LAB_001ce036:
      uVar33 = uVar33 + 1;
    } while (uVar33 != uVar31);
  }
  if (vctxt->nbAttrInfos == 0) {
    return 0;
  }
  if ((vctxt->options & 1) != 0) {
    node = (xmlSchemaTypePtr)(long)vctxt->depth;
    if ((vctxt->elemInfos[(long)node] != (xmlSchemaNodeInfoPtr)0x0) &&
       (node_01 = vctxt->elemInfos[(long)node]->node, node_01 != (xmlNodePtr)0x0)) {
      if (node_01->doc == (_xmlDoc *)0x0) {
        node_01 = (xmlNodePtr)0x0;
      }
      goto LAB_001ce11c;
    }
  }
  node_01 = (xmlNodePtr)0x0;
LAB_001ce11c:
  if (0 < vctxt->nbAttrInfos) {
    lVar30 = 0;
    do {
      pxVar5 = (xmlSchemaNodeInfoPtr)vctxt->attrInfos[lVar30];
      if ((pxVar5->depth == 8) || (pxVar5->depth == 2)) {
        if (pxVar5->typeDef != (xmlSchemaTypePtr)0x0) {
          vctxt->inode = pxVar5;
          pxVar28 = vctxt;
          if (vctxt->xpathStates == (xmlSchemaIDCStateObjPtr_conflict)0x0) {
            iVar9 = 0;
LAB_001ce18d:
            if (pxVar5->depth != 8) {
              if (vctxt->value != (xmlSchemaValPtr)0x0) {
                xmlSchemaFreeValue(vctxt->value);
                vctxt->value = (xmlSchemaValPtr)0x0;
              }
              bVar34 = true;
              if ((((*(xmlSchemaAttributePtr *)&pxVar5->normVal)->flags & 0x200) == 0) &&
                 ((pxVar5->decl == (xmlSchemaElementPtr)0x0 ||
                  (((ulong)pxVar5->decl->ref & 0x200) == 0)))) {
                bVar34 = false;
              }
              bVar7 = (bool)(iVar9 == 0 & (bVar34 ^ 1U));
              if (bVar7) {
                pxVar19 = pxVar5->typeDef;
                node_00 = pxVar5->node;
                node = (xmlSchemaTypePtr)pxVar5->value;
                pxVar28 = (xmlSchemaValidCtxtPtr)0x0;
              }
              else {
                *(byte *)&pxVar5->flags = (byte)pxVar5->flags | 0x10;
                pxVar19 = pxVar5->typeDef;
                node_00 = pxVar5->node;
                node = (xmlSchemaTypePtr)pxVar5->value;
                pxVar28 = (xmlSchemaValidCtxtPtr)&pxVar5->val;
              }
              iVar21 = xmlSchemaVCheckCVCSimpleType
                                 ((xmlSchemaAbstractCtxtPtr)vctxt,node_00,pxVar19,(xmlChar *)node,
                                  (xmlSchemaValPtr *)pxVar28,1,(uint)!bVar7,0);
              if (iVar21 == 0) {
                if (bVar34) {
                  if (pxVar5->val == (xmlSchemaValPtr)0x0) {
                    pp_Var16 = __xmlGenericError();
                    p_Var22 = *pp_Var16;
                    ppvVar17 = __xmlGenericErrorContext();
                    pvVar27 = *ppvVar17;
                    node = (xmlSchemaTypePtr)0x652e;
LAB_001ce598:
                    (*p_Var22)(pvVar27,"Unimplemented block at %s:%d\n",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xmlschemas.c"
                              );
                  }
                  else {
                    pxVar6 = pxVar5->decl;
                    if ((pxVar6 == (xmlSchemaElementPtr)0x0) ||
                       (node = pxVar6->subtypes, node == (xmlSchemaTypePtr)0x0)) {
                      pxVar26 = (xmlSchemaAttributePtr)
                                (*(xmlSchemaAttributePtr *)&pxVar5->normVal)->defVal;
                      if (pxVar26 == (xmlSchemaAttributePtr)0x0) {
                        pp_Var16 = __xmlGenericError();
                        p_Var22 = *pp_Var16;
                        ppvVar17 = __xmlGenericErrorContext();
                        pvVar27 = *ppvVar17;
                        node = (xmlSchemaTypePtr)0x6544;
                        goto LAB_001ce598;
                      }
                      pxVar5->idcTable =
                           (xmlSchemaPSVIIDCBindingPtr_conflict)
                           (*(xmlSchemaAttributePtr *)&pxVar5->normVal)->defValue;
                    }
                    else {
                      pxVar26 = pxVar6->attributes;
                      if (pxVar26 == (xmlSchemaAttributePtr)0x0) {
                        pp_Var16 = __xmlGenericError();
                        p_Var22 = *pp_Var16;
                        ppvVar17 = __xmlGenericErrorContext();
                        pvVar27 = *ppvVar17;
                        node = (xmlSchemaTypePtr)0x6535;
                        goto LAB_001ce598;
                      }
                      pxVar5->idcTable = (xmlSchemaPSVIIDCBindingPtr_conflict)node;
                    }
                    iVar21 = xmlSchemaAreValuesEqual(pxVar5->val,(xmlSchemaValPtr)pxVar26);
                    if (iVar21 == 0) {
                      pxVar5->depth = 7;
                    }
                  }
                }
              }
              else {
                if (iVar21 == -1) {
                  pcVar20 = "calling xmlSchemaStreamValidateSimpleTypeValue()";
                  goto LAB_001ce7de;
                }
                pxVar5->depth = 5;
              }
LAB_001ce5a3:
              if (iVar9 == 0) {
                pxVar23 = vctxt->xpathStates;
                while ((pxVar23 != (xmlSchemaIDCStateObjPtr_conflict)0x0 &&
                       (iVar9 = xmlStreamPop((xmlStreamCtxtPtr)pxVar23->xpathCtxt), iVar9 != -1))) {
                  pxVar23 = pxVar23->next;
                }
              }
              else {
                iVar9 = xmlSchemaXPathProcessHistory(vctxt,vctxt->depth + 1);
                if (iVar9 == -1) goto LAB_001ce7d2;
              }
              goto LAB_001ce5bd;
            }
            node = (xmlSchemaTypePtr)CONCAT71((int7)((ulong)node >> 8),iVar9 == 0);
            if (node_01 == (xmlNodePtr)0x0 && iVar9 == 0) {
LAB_001ce30d:
              if (node_01 == (xmlNodePtr)0x0) goto LAB_001ce5a3;
              pxVar19 = (xmlSchemaTypePtr)pxVar5->value;
              pxVar14 = (xmlSchemaTypePtr)
                        xmlSchemaNormalizeValue(pxVar5->typeDef,(xmlChar *)pxVar19);
              if (pxVar14 != (xmlSchemaTypePtr)0x0) {
                pxVar19 = pxVar14;
              }
              if (pxVar5->nsName == (xmlChar *)0x0) {
                pxVar15 = xmlNewProp(node_01,pxVar5->localName,(xmlChar *)pxVar19);
                if (pxVar15 == (xmlAttrPtr)0x0) {
                  node = (xmlSchemaTypePtr)0x0;
                  xmlSchemaInternalErr2
                            ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaVAttributesComplex",
                             "calling xmlNewProp()",(xmlChar *)0x0,(xmlChar *)pxVar28);
                  iVar21 = 0x11;
                  iVar32 = 0x11;
                }
                else {
                  iVar21 = 0;
                  iVar32 = 0;
                }
joined_r0x001ce49c:
                if (pxVar14 != (xmlSchemaTypePtr)0x0) {
                  (*xmlFree)(pxVar14);
                  iVar32 = iVar21;
                }
              }
              else {
                ns = xmlSearchNsByHref(node_01->doc,node_01,pxVar5->nsName);
                if (ns == (xmlNsPtr)0x0) {
                  uVar31 = 0xffffffff;
                  do {
                    uVar8 = uVar31 + 1;
                    node = (xmlSchemaTypePtr)(ulong)uVar8;
                    snprintf((char *)local_40,0xc,"p%d");
                    ns = xmlSearchNs(node_01->doc,node_01,(xmlChar *)local_40);
                    if (uVar31 == 999) {
                      node = (xmlSchemaTypePtr)0x0;
                      xmlSchemaInternalErr2
                                ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaVAttributesComplex",
                                 "could not compute a ns prefix for a default/fixed attribute",
                                 (xmlChar *)0x0,(xmlChar *)pxVar28);
                      iVar32 = 0x11;
                      if (pxVar14 == (xmlSchemaTypePtr)0x0) {
                        bVar34 = false;
                      }
                      else {
                        (*xmlFree)(pxVar14);
                        bVar34 = false;
                      }
                      goto LAB_001ce4e0;
                    }
                    uVar31 = uVar8;
                  } while (ns != (xmlNsPtr)0x0);
                  bVar34 = uVar8 < 1000;
                  ns = xmlNewNs(vctxt->validationRoot,pxVar5->nsName,(xmlChar *)local_40);
                  iVar32 = 0;
LAB_001ce4e0:
                  if (bVar34) goto LAB_001ce4e4;
                }
                else {
LAB_001ce4e4:
                  xmlNewNsProp(node_01,ns,pxVar5->localName,(xmlChar *)pxVar19);
                  iVar32 = 0;
                  node = pxVar19;
                }
                if (iVar32 == 0) {
                  iVar21 = 0;
                  goto joined_r0x001ce49c;
                }
              }
              if (iVar32 != 0) {
                if (iVar32 != 0x11) {
                  return iVar9;
                }
                goto LAB_001ce7f1;
              }
              goto LAB_001ce5a3;
            }
            node = pxVar5->decl->subtypes;
            if (node == (xmlSchemaTypePtr)0x0) {
              node = (xmlSchemaTypePtr)(*(xmlSchemaAttributePtr *)&pxVar5->normVal)->defValue;
              pxVar5->value = (xmlChar *)node;
              ppxVar12 = (xmlSchemaAttributePtr *)
                         &(*(xmlSchemaAttributePtr *)&pxVar5->normVal)->defVal;
            }
            else {
              pxVar5->value = (xmlChar *)node;
              ppxVar12 = &pxVar5->decl->attributes;
            }
            pxVar26 = *ppxVar12;
            pxVar5->val = (xmlSchemaValPtr)pxVar26;
            if (pxVar26 == (xmlSchemaAttributePtr)0x0) {
              pcVar20 = "default/fixed value on an attribute use was not precomputed";
            }
            else {
              pxVar13 = xmlSchemaCopyValue((xmlSchemaValPtr)pxVar26);
              pxVar5->val = pxVar13;
              if (pxVar13 != (xmlSchemaValPtr)0x0) goto LAB_001ce30d;
              pcVar20 = "calling xmlSchemaCopyValue()";
            }
          }
          else {
            iVar9 = xmlSchemaXPathEvaluate(vctxt,XML_ATTRIBUTE_NODE);
            if (iVar9 != -1) goto LAB_001ce18d;
LAB_001ce7d2:
            pcVar20 = "calling xmlSchemaXPathEvaluate()";
          }
LAB_001ce7de:
          xmlSchemaInternalErr2
                    ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaVAttributesComplex",pcVar20,
                     (xmlChar *)0x0,(xmlChar *)pxVar28);
LAB_001ce7f1:
          vctxt->inode = vctxt->elemInfos[vctxt->depth];
          return -1;
        }
        pxVar5->depth = 6;
      }
LAB_001ce5bd:
      lVar30 = lVar30 + 1;
    } while (lVar30 < vctxt->nbAttrInfos);
  }
  if (0 < vctxt->nbAttrInfos) {
    lVar30 = 0;
    do {
      pxVar5 = (xmlSchemaNodeInfoPtr)vctxt->attrInfos[lVar30];
      uVar31 = pxVar5->depth;
      if ((uVar31 < 0x12) && ((0x26004U >> (uVar31 & 0x1f) & 1) != 0))
      goto switchD_001ce680_caseD_2;
      vctxt->inode = pxVar5;
      switch(uVar31) {
      case 1:
        if (*(int *)&pxVar5->field_0x5c == 0) {
          if (pxVar1->attributeWildcard == (xmlSchemaWildcardPtr)0x0) {
            xVar25 = XML_SCHEMAV_CVC_COMPLEX_TYPE_3_2_1;
          }
          else {
            xVar25 = XML_SCHEMAV_CVC_COMPLEX_TYPE_3_2_2;
          }
          xmlSchemaIllegalAttrErr
                    ((xmlSchemaAbstractCtxtPtr)vctxt,xVar25,(xmlSchemaAttrInfoPtr)pxVar5,
                     (xmlNodePtr)node);
        }
        break;
      case 4:
        local_40[0] = (xmlChar *)0x0;
        vctxt->inode = vctxt->elemInfos[vctxt->depth];
        pxVar18 = xmlSchemaFormatQName
                            (local_40,(*(xmlSchemaAttributePtr *)&pxVar5->normVal)->targetNamespace,
                             (*(xmlSchemaAttributePtr *)&pxVar5->normVal)->name);
        node = (xmlSchemaTypePtr)0x0;
        xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,XML_SCHEMAV_CVC_COMPLEX_TYPE_4,
                            (xmlNodePtr)0x0,(xmlSchemaBasicItemPtr)0x0,
                            "The attribute \'%s\' is required but missing",pxVar18,(xmlChar *)0x0,
                            (xmlChar *)0x0,(xmlChar *)0x0);
        if (local_40[0] != (xmlChar *)0x0) {
          (*xmlFree)(local_40[0]);
          local_40[0] = (xmlChar *)0x0;
        }
        break;
      case 6:
        xVar25 = XML_SCHEMAV_CVC_ATTRIBUTE_2;
        pcVar20 = "The type definition is absent";
        goto LAB_001ce794;
      case 7:
        pxVar18 = pxVar5->value;
        str2 = pxVar5->idcTable;
        xVar25 = XML_SCHEMAV_CVC_AU;
        pcVar20 = "The value \'%s\' does not match the fixed value constraint \'%s\'";
        goto LAB_001ce797;
      case 10:
        xVar25 = XML_SCHEMAV_CVC_WILDCARD;
        pcVar20 = 
        "No matching global attribute declaration available, but demanded by the strict wildcard";
LAB_001ce794:
        str2 = (xmlSchemaPSVIIDCBindingPtr_conflict)0x0;
        pxVar18 = (xmlChar *)0x0;
LAB_001ce797:
        node = (xmlSchemaTypePtr)0x0;
        xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,xVar25,(xmlNodePtr)0x0,
                            (xmlSchemaBasicItemPtr)0x0,pcVar20,pxVar18,(xmlChar *)str2,
                            (xmlChar *)0x0,(xmlChar *)0x0);
      }
switchD_001ce680_caseD_2:
      lVar30 = lVar30 + 1;
    } while (lVar30 < vctxt->nbAttrInfos);
  }
  vctxt->inode = vctxt->elemInfos[vctxt->depth];
  return 0;
}

Assistant:

static int
xmlSchemaVAttributesComplex(xmlSchemaValidCtxtPtr vctxt)
{
    xmlSchemaTypePtr type = vctxt->inode->typeDef;
    xmlSchemaItemListPtr attrUseList;
    xmlSchemaAttributeUsePtr attrUse = NULL;
    xmlSchemaAttributePtr attrDecl = NULL;
    xmlSchemaAttrInfoPtr iattr, tmpiattr;
    int i, j, found, nbAttrs, nbUses;
    int xpathRes = 0, res, wildIDs = 0, fixed;
    xmlNodePtr defAttrOwnerElem = NULL;

    /*
    * SPEC (cvc-attribute)
    * (1) "The declaration must not be `absent` (see Missing
    * Sub-components ($5.3) for how this can fail to be
    * the case)."
    * (2) "Its {type definition} must not be absent."
    *
    * NOTE (1) + (2): This is not handled here, since we currently do not
    * allow validation against schemas which have missing sub-components.
    *
    * SPEC (cvc-complex-type)
    * (3) "For each attribute information item in the element information
    * item's [attributes] excepting those whose [namespace name] is
    * identical to http://www.w3.org/2001/XMLSchema-instance and whose
    * [local name] is one of type, nil, schemaLocation or
    * noNamespaceSchemaLocation, the appropriate case among the following
    * must be true:
    *
    */
    attrUseList = (xmlSchemaItemListPtr) type->attrUses;
    /*
    * @nbAttrs is the number of attributes present in the instance.
    */
    nbAttrs = vctxt->nbAttrInfos;
    if (attrUseList != NULL)
	nbUses = attrUseList->nbItems;
    else
	nbUses = 0;
    for (i = 0; i < nbUses; i++) {
        found = 0;
	attrUse = attrUseList->items[i];
	attrDecl = WXS_ATTRUSE_DECL(attrUse);
        for (j = 0; j < nbAttrs; j++) {
	    iattr = vctxt->attrInfos[j];
	    /*
	    * SPEC (cvc-complex-type) (3)
	    * Skip meta attributes.
	    */
	    if (iattr->metaType)
		continue;
	    if (iattr->localName[0] != attrDecl->name[0])
		continue;
	    if (!xmlStrEqual(iattr->localName, attrDecl->name))
		continue;
	    if (!xmlStrEqual(iattr->nsName, attrDecl->targetNamespace))
		continue;
	    found = 1;
	    /*
	    * SPEC (cvc-complex-type)
	    * (3.1) "If there is among the {attribute uses} an attribute
	    * use with an {attribute declaration} whose {name} matches
	    * the attribute information item's [local name] and whose
	    * {target namespace} is identical to the attribute information
	    * item's [namespace name] (where an `absent` {target namespace}
	    * is taken to be identical to a [namespace name] with no value),
	    * then the attribute information must be `valid` with respect
	    * to that attribute use as per Attribute Locally Valid (Use)
	    * ($3.5.4). In this case the {attribute declaration} of that
	    * attribute use is the `context-determined declaration` for the
	    * attribute information item with respect to Schema-Validity
	    * Assessment (Attribute) ($3.2.4) and
	    * Assessment Outcome (Attribute) ($3.2.5).
	    */
	    iattr->state = XML_SCHEMAS_ATTR_ASSESSED;
	    iattr->use = attrUse;
	    /*
	    * Context-determined declaration.
	    */
	    iattr->decl = attrDecl;
	    iattr->typeDef = attrDecl->subtypes;
	    break;
	}

	if (found)
	    continue;

	if (attrUse->occurs == XML_SCHEMAS_ATTR_USE_REQUIRED) {
	    /*
	    * Handle non-existent, required attributes.
	    *
	    * SPEC (cvc-complex-type)
	    * (4) "The {attribute declaration} of each attribute use in
	    * the {attribute uses} whose {required} is true matches one
	    * of the attribute information items in the element information
	    * item's [attributes] as per clause 3.1 above."
	    */
	    tmpiattr = xmlSchemaGetFreshAttrInfo(vctxt);
	    if (tmpiattr == NULL) {
		VERROR_INT(
		    "xmlSchemaVAttributesComplex",
		    "calling xmlSchemaGetFreshAttrInfo()");
		return (-1);
	    }
	    tmpiattr->state = XML_SCHEMAS_ATTR_ERR_MISSING;
	    tmpiattr->use = attrUse;
	    tmpiattr->decl = attrDecl;
	} else if ((attrUse->occurs == XML_SCHEMAS_ATTR_USE_OPTIONAL) &&
	    ((attrUse->defValue != NULL) ||
	     (attrDecl->defValue != NULL))) {
	    /*
	    * Handle non-existent, optional, default/fixed attributes.
	    */
	    tmpiattr = xmlSchemaGetFreshAttrInfo(vctxt);
	    if (tmpiattr == NULL) {
		VERROR_INT(
		    "xmlSchemaVAttributesComplex",
		    "calling xmlSchemaGetFreshAttrInfo()");
		return (-1);
	    }
	    tmpiattr->state = XML_SCHEMAS_ATTR_DEFAULT;
	    tmpiattr->use = attrUse;
	    tmpiattr->decl = attrDecl;
	    tmpiattr->typeDef = attrDecl->subtypes;
	    tmpiattr->localName = attrDecl->name;
	    tmpiattr->nsName = attrDecl->targetNamespace;
	}
    }

    if (vctxt->nbAttrInfos == 0)
	return (0);
    /*
    * Validate against the wildcard.
    */
    if (type->attributeWildcard != NULL) {
	/*
	* SPEC (cvc-complex-type)
	* (3.2.1) "There must be an {attribute wildcard}."
	*/
	for (i = 0; i < nbAttrs; i++) {
	    iattr = vctxt->attrInfos[i];
	    /*
	    * SPEC (cvc-complex-type) (3)
	    * Skip meta attributes.
	    */
	    if (iattr->state != XML_SCHEMAS_ATTR_UNKNOWN)
		continue;
	    /*
	    * SPEC (cvc-complex-type)
	    * (3.2.2) "The attribute information item must be `valid` with
	    * respect to it as defined in Item Valid (Wildcard) ($3.10.4)."
	    *
	    * SPEC Item Valid (Wildcard) (cvc-wildcard)
	    * "... its [namespace name] must be `valid` with respect to
	    * the wildcard constraint, as defined in Wildcard allows
	    * Namespace Name ($3.10.4)."
	    */
	    if (xmlSchemaCheckCVCWildcardNamespace(type->attributeWildcard,
		    iattr->nsName) == 0) {
		/*
		* Handle processContents.
		*
		* SPEC (cvc-wildcard):
		* processContents | context-determined declaration:
		* "strict"          "mustFind"
		* "lax"             "none"
		* "skip"            "skip"
		*/
		if (type->attributeWildcard->processContents ==
		    XML_SCHEMAS_ANY_SKIP) {
		     /*
		    * context-determined declaration = "skip"
		    *
		    * SPEC PSVI Assessment Outcome (Attribute)
		    * [validity] = "notKnown"
		    * [validation attempted] = "none"
		    */
		    iattr->state = XML_SCHEMAS_ATTR_WILD_SKIP;
		    continue;
		}
		/*
		* Find an attribute declaration.
		*/
		iattr->decl = xmlSchemaGetAttributeDecl(vctxt->schema,
		    iattr->localName, iattr->nsName);
		if (iattr->decl != NULL) {
		    iattr->state = XML_SCHEMAS_ATTR_ASSESSED;
		    /*
		    * SPEC (cvc-complex-type)
		    * (5) "Let [Definition:]  the wild IDs be the set of
		    * all attribute information item to which clause 3.2
		    * applied and whose `validation` resulted in a
		    * `context-determined declaration` of mustFind or no
		    * `context-determined declaration` at all, and whose
		    * [local name] and [namespace name] resolve (as
		    * defined by QName resolution (Instance) ($3.15.4)) to
		    * an attribute declaration whose {type definition} is
		    * or is derived from ID. Then all of the following
		    * must be true:"
		    */
		    iattr->typeDef = WXS_ATTR_TYPEDEF(iattr->decl);
		    if (xmlSchemaIsDerivedFromBuiltInType(
			iattr->typeDef, XML_SCHEMAS_ID)) {
			/*
			* SPEC (5.1) "There must be no more than one
			* item in `wild IDs`."
			*/
			if (wildIDs != 0) {
			    /* VAL TODO */
			    iattr->state = XML_SCHEMAS_ATTR_ERR_WILD_DUPLICATE_ID;
			    TODO
			    continue;
			}
			wildIDs++;
			/*
			* SPEC (cvc-complex-type)
			* (5.2) "If `wild IDs` is non-empty, there must not
			* be any attribute uses among the {attribute uses}
			* whose {attribute declaration}'s {type definition}
			* is or is derived from ID."
			*/
                        if (attrUseList != NULL) {
                            for (j = 0; j < attrUseList->nbItems; j++) {
                                if (xmlSchemaIsDerivedFromBuiltInType(
                                    WXS_ATTRUSE_TYPEDEF(attrUseList->items[j]),
                                    XML_SCHEMAS_ID)) {
                                    /* URGENT VAL TODO: implement */
                            iattr->state = XML_SCHEMAS_ATTR_ERR_WILD_AND_USE_ID;
                                    TODO
                                    break;
                                }
                            }
                        }
		    }
		} else if (type->attributeWildcard->processContents ==
		    XML_SCHEMAS_ANY_LAX) {
		    iattr->state = XML_SCHEMAS_ATTR_WILD_LAX_NO_DECL;
		    /*
		    * SPEC PSVI Assessment Outcome (Attribute)
		    * [validity] = "notKnown"
		    * [validation attempted] = "none"
		    */
		} else {
		    iattr->state = XML_SCHEMAS_ATTR_ERR_WILD_STRICT_NO_DECL;
		}
	    }
	}
    }

    if (vctxt->nbAttrInfos == 0)
	return (0);

    /*
    * Get the owner element; needed for creation of default attributes.
    * This fixes bug #341337, reported by David Grohmann.
    */
    if (vctxt->options & XML_SCHEMA_VAL_VC_I_CREATE) {
	xmlSchemaNodeInfoPtr ielem = vctxt->elemInfos[vctxt->depth];
	if (ielem && ielem->node && ielem->node->doc)
	    defAttrOwnerElem = ielem->node;
    }
    /*
    * Validate values, create default attributes, evaluate IDCs.
    */
    for (i = 0; i < vctxt->nbAttrInfos; i++) {
	iattr = vctxt->attrInfos[i];
	/*
	* VAL TODO: Note that we won't try to resolve IDCs to
	* "lax" and "skip" validated attributes. Check what to
	* do in this case.
	*/
	if ((iattr->state != XML_SCHEMAS_ATTR_ASSESSED) &&
	    (iattr->state != XML_SCHEMAS_ATTR_DEFAULT))
	    continue;
	/*
	* VAL TODO: What to do if the type definition is missing?
	*/
	if (iattr->typeDef == NULL) {
	    iattr->state = XML_SCHEMAS_ATTR_ERR_NO_TYPE;
	    continue;
	}

	ACTIVATE_ATTRIBUTE(iattr);
	fixed = 0;
	xpathRes = 0;

	if (vctxt->xpathStates != NULL) {
	    /*
	    * Evaluate IDCs.
	    */
	    xpathRes = xmlSchemaXPathEvaluate(vctxt,
		XML_ATTRIBUTE_NODE);
	    if (xpathRes == -1) {
		VERROR_INT("xmlSchemaVAttributesComplex",
		    "calling xmlSchemaXPathEvaluate()");
		goto internal_error;
	    }
	}

	if (iattr->state == XML_SCHEMAS_ATTR_DEFAULT) {
	    /*
	    * Default/fixed attributes.
	    * We need the value only if we need to resolve IDCs or
	    * will create default attributes.
	    */
	    if ((xpathRes) || (defAttrOwnerElem)) {
		if (iattr->use->defValue != NULL) {
		    iattr->value = (xmlChar *) iattr->use->defValue;
		    iattr->val = iattr->use->defVal;
		} else {
		    iattr->value = (xmlChar *) iattr->decl->defValue;
		    iattr->val = iattr->decl->defVal;
		}
		/*
		* IDCs will consume the precomputed default value,
		* so we need to clone it.
		*/
		if (iattr->val == NULL) {
		    VERROR_INT("xmlSchemaVAttributesComplex",
			"default/fixed value on an attribute use was "
			"not precomputed");
		    goto internal_error;
		}
		iattr->val = xmlSchemaCopyValue(iattr->val);
		if (iattr->val == NULL) {
		    VERROR_INT("xmlSchemaVAttributesComplex",
			"calling xmlSchemaCopyValue()");
		    goto internal_error;
		}
	    }
	    /*
	    * PSVI: Add the default attribute to the current element.
	    * VAL TODO: Should we use the *normalized* value? This currently
	    *   uses the *initial* value.
	    */

	    if (defAttrOwnerElem) {
		xmlChar *normValue;
		const xmlChar *value;

		value = iattr->value;
		/*
		* Normalize the value.
		*/
		normValue = xmlSchemaNormalizeValue(iattr->typeDef,
		    iattr->value);
		if (normValue != NULL)
		    value = BAD_CAST normValue;

		if (iattr->nsName == NULL) {
		    if (xmlNewProp(defAttrOwnerElem,
			iattr->localName, value) == NULL) {
			VERROR_INT("xmlSchemaVAttributesComplex",
			    "calling xmlNewProp()");
			if (normValue != NULL)
			    xmlFree(normValue);
			goto internal_error;
		    }
		} else {
		    xmlNsPtr ns;

		    ns = xmlSearchNsByHref(defAttrOwnerElem->doc,
			defAttrOwnerElem, iattr->nsName);
		    if (ns == NULL) {
			xmlChar prefix[12];
			int counter = 0;

			/*
			* Create a namespace declaration on the validation
			* root node if no namespace declaration is in scope.
			*/
			do {
			    snprintf((char *) prefix, 12, "p%d", counter++);
			    ns = xmlSearchNs(defAttrOwnerElem->doc,
				defAttrOwnerElem, BAD_CAST prefix);
			    if (counter > 1000) {
				VERROR_INT(
				    "xmlSchemaVAttributesComplex",
				    "could not compute a ns prefix for a "
				    "default/fixed attribute");
				if (normValue != NULL)
				    xmlFree(normValue);
				goto internal_error;
			    }
			} while (ns != NULL);
			ns = xmlNewNs(vctxt->validationRoot,
			    iattr->nsName, BAD_CAST prefix);
		    }
		    /*
		    * TODO:
		    * http://lists.w3.org/Archives/Public/www-xml-schema-comments/2005JulSep/0406.html
		    * If we have QNames: do we need to ensure there's a
		    * prefix defined for the QName?
		    */
		    xmlNewNsProp(defAttrOwnerElem, ns, iattr->localName, value);
		}
		if (normValue != NULL)
		    xmlFree(normValue);
	    }
	    /*
	    * Go directly to IDC evaluation.
	    */
	    goto eval_idcs;
	}
	/*
	* Validate the value.
	*/
	if (vctxt->value != NULL) {
	    /*
	    * Free last computed value; just for safety reasons.
	    */
	    xmlSchemaFreeValue(vctxt->value);
	    vctxt->value = NULL;
	}
	/*
	* Note that the attribute *use* can be unavailable, if
	* the attribute was a wild attribute.
	*/
	if ((iattr->decl->flags & XML_SCHEMAS_ATTR_FIXED) ||
	    ((iattr->use != NULL) &&
	     (iattr->use->flags & XML_SCHEMAS_ATTR_FIXED)))
	    fixed = 1;
	else
	    fixed = 0;
	/*
	* SPEC (cvc-attribute)
	* (3) "The item's `normalized value` must be locally `valid`
	* with respect to that {type definition} as per
	* String Valid ($3.14.4)."
	*
	* VAL TODO: Do we already have the
	* "normalized attribute value" here?
	*/
	if (xpathRes || fixed) {
	    iattr->flags |= XML_SCHEMA_NODE_INFO_VALUE_NEEDED;
	    /*
	    * Request a computed value.
	    */
	    res = xmlSchemaVCheckCVCSimpleType(
		ACTXT_CAST vctxt,
		iattr->node, iattr->typeDef, iattr->value, &(iattr->val),
		1, 1, 0);
	} else {
	    res = xmlSchemaVCheckCVCSimpleType(
		ACTXT_CAST vctxt,
		iattr->node, iattr->typeDef, iattr->value, NULL,
		1, 0, 0);
	}

	if (res != 0) {
	    if (res == -1) {
		VERROR_INT("xmlSchemaVAttributesComplex",
		    "calling xmlSchemaStreamValidateSimpleTypeValue()");
		goto internal_error;
	    }
	    iattr->state = XML_SCHEMAS_ATTR_INVALID_VALUE;
	    /*
	    * SPEC PSVI Assessment Outcome (Attribute)
	    * [validity] = "invalid"
	    */
	    goto eval_idcs;
	}

	if (fixed) {
	    /*
	    * SPEC Attribute Locally Valid (Use) (cvc-au)
	    * "For an attribute information item to be `valid`
	    * with respect to an attribute use its *normalized*
	    * value must match the *canonical* lexical
	    * representation of the attribute use's {value
	    * constraint}value, if it is present and fixed."
	    *
	    * VAL TODO: The requirement for the *canonical* value
	    * will be removed in XML Schema 1.1.
	    */
	    /*
	    * SPEC Attribute Locally Valid (cvc-attribute)
	    * (4) "The item's *actual* value must match the *value* of
	    * the {value constraint}, if it is present and fixed."
	    */
	    if (iattr->val == NULL) {
		/* VAL TODO: A value was not precomputed. */
		TODO
		goto eval_idcs;
	    }
	    if ((iattr->use != NULL) &&
		(iattr->use->defValue != NULL)) {
		if (iattr->use->defVal == NULL) {
		    /* VAL TODO: A default value was not precomputed. */
		    TODO
		    goto eval_idcs;
		}
		iattr->vcValue = iattr->use->defValue;
		/*
		if (xmlSchemaCompareValuesWhtsp(attr->val,
		    (xmlSchemaWhitespaceValueType) ws,
		    attr->use->defVal,
		    (xmlSchemaWhitespaceValueType) ws) != 0) {
		*/
		if (! xmlSchemaAreValuesEqual(iattr->val, iattr->use->defVal))
		    iattr->state = XML_SCHEMAS_ATTR_ERR_FIXED_VALUE;
	    } else {
		if (iattr->decl->defVal == NULL) {
		    /* VAL TODO: A default value was not precomputed. */
		    TODO
		    goto eval_idcs;
		}
		iattr->vcValue = iattr->decl->defValue;
		/*
		if (xmlSchemaCompareValuesWhtsp(attr->val,
		    (xmlSchemaWhitespaceValueType) ws,
		    attrDecl->defVal,
		    (xmlSchemaWhitespaceValueType) ws) != 0) {
		*/
		if (! xmlSchemaAreValuesEqual(iattr->val, iattr->decl->defVal))
		    iattr->state = XML_SCHEMAS_ATTR_ERR_FIXED_VALUE;
	    }
	    /*
	    * [validity] = "valid"
	    */
	}
eval_idcs:
	/*
	* Evaluate IDCs.
	*/
	if (xpathRes) {
	    if (xmlSchemaXPathProcessHistory(vctxt,
		vctxt->depth +1) == -1) {
		VERROR_INT("xmlSchemaVAttributesComplex",
		    "calling xmlSchemaXPathEvaluate()");
		goto internal_error;
	    }
	} else if (vctxt->xpathStates != NULL)
	    xmlSchemaXPathPop(vctxt);
    }

    /*
    * Report errors.
    */
    for (i = 0; i < vctxt->nbAttrInfos; i++) {
	iattr = vctxt->attrInfos[i];
	if ((iattr->state == XML_SCHEMAS_ATTR_META) ||
	    (iattr->state == XML_SCHEMAS_ATTR_ASSESSED) ||
	    (iattr->state == XML_SCHEMAS_ATTR_WILD_SKIP) ||
	    (iattr->state == XML_SCHEMAS_ATTR_WILD_LAX_NO_DECL))
	    continue;
	ACTIVATE_ATTRIBUTE(iattr);
	switch (iattr->state) {
	    case XML_SCHEMAS_ATTR_ERR_MISSING: {
		    xmlChar *str = NULL;
		    ACTIVATE_ELEM;
		    xmlSchemaCustomErr(ACTXT_CAST vctxt,
			XML_SCHEMAV_CVC_COMPLEX_TYPE_4, NULL, NULL,
			"The attribute '%s' is required but missing",
			xmlSchemaFormatQName(&str,
			    iattr->decl->targetNamespace,
			    iattr->decl->name),
			NULL);
		    FREE_AND_NULL(str)
		    break;
		}
	    case XML_SCHEMAS_ATTR_ERR_NO_TYPE:
		VERROR(XML_SCHEMAV_CVC_ATTRIBUTE_2, NULL,
		    "The type definition is absent");
		break;
	    case XML_SCHEMAS_ATTR_ERR_FIXED_VALUE:
		xmlSchemaCustomErr(ACTXT_CAST vctxt,
		    XML_SCHEMAV_CVC_AU, NULL, NULL,
		    "The value '%s' does not match the fixed "
		    "value constraint '%s'",
		    iattr->value, iattr->vcValue);
		break;
	    case XML_SCHEMAS_ATTR_ERR_WILD_STRICT_NO_DECL:
		VERROR(XML_SCHEMAV_CVC_WILDCARD, NULL,
		    "No matching global attribute declaration available, but "
		    "demanded by the strict wildcard");
		break;
	    case XML_SCHEMAS_ATTR_UNKNOWN:
		if (iattr->metaType)
		    break;
		/*
		* MAYBE VAL TODO: One might report different error messages
		* for the following errors.
		*/
		if (type->attributeWildcard == NULL) {
		    xmlSchemaIllegalAttrErr(ACTXT_CAST vctxt,
			XML_SCHEMAV_CVC_COMPLEX_TYPE_3_2_1, iattr, NULL);
		} else {
		    xmlSchemaIllegalAttrErr(ACTXT_CAST vctxt,
			XML_SCHEMAV_CVC_COMPLEX_TYPE_3_2_2, iattr, NULL);
		}
		break;
	    default:
		break;
	}
    }

    ACTIVATE_ELEM;
    return (0);
internal_error:
    ACTIVATE_ELEM;
    return (-1);
}